

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crash.h
# Opt level: O2

void __thiscall bandit::reporter::crash::it_failed(crash *this,string *desc,assertion_exception *ex)

{
  int *piVar1;
  failure_formatter_t *pfVar2;
  ostream *poVar3;
  stringstream ss;
  string local_1e0;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  piVar1 = &(this->super_progress_base).specs_failed_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::stringstream::stringstream(local_1a0);
  progress_base::current_context_name_abi_cxx11_(&local_1e0,&this->super_progress_base);
  poVar3 = std::operator<<(local_190,(string *)&local_1e0);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)desc);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  pfVar2 = (this->super_progress_base).failure_formatter_;
  (*pfVar2->_vptr_interface[2])(local_1c0,pfVar2,ex);
  std::operator<<(poVar3,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_progress_base).failures_,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  poVar3 = std::operator<<(this->stm_,"FAILED");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        ++specs_failed_;

        std::stringstream ss;
        ss << current_context_name() << " " << desc << ":" << std::endl
           << failure_formatter_.format(ex);
        failures_.push_back(ss.str());

        stm_ << "FAILED" << std::endl;
      }